

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest::TestCompression
          (ZLIBBufferCompressorTest *this,string *text,uint32_t chunk_size)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  AssertHelper local_c0;
  Message local_b8;
  allocator<char> local_a9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  uint32_t chunk_size_local;
  string *text_local;
  ZLIBBufferCompressorTest *this_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = chunk_size;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)text);
  lVar3 = std::__cxx11::string::operator[]((ulong)text);
  lVar4 = std::__cxx11::string::size();
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_38,pcVar2,
             (char *)(lVar3 + lVar4),&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  TestCompression((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,this,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_);
  local_a0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar.message_);
  local_a8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((string *)&local_98,local_a0,local_a8,&local_a9);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_78,"text","std::string(result.begin(), result.end())",text,
             &local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void ZLIBBufferCompressorTest::TestCompression(std::string& text, uint32_t chunk_size)
{
    std::vector<unsigned char> bytes = std::vector<unsigned char>(&text[0], &text[0] + text.size());
    std::vector<unsigned char> result = TestCompression(bytes, chunk_size);
    EXPECT_EQ(text, std::string(result.begin(), result.end()));
}